

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O1

void jsons_print_notif(lyout *out,lys_node *node,int *first)

{
  char *label;
  char *val;
  lys_module *plVar1;
  int *first_00;
  
  label = node->name;
  val = jsons_nodetype_str(node->nodetype);
  jsons_print_object(out,label,"nodetype",val,0,first);
  plVar1 = lys_main_module(node->module);
  ly_print(out,",\"module\":\"%s\"",plVar1->name);
  if ((node->module->field_0x40 & 1) != 0) {
    ly_print(out,",\"included-from\":\"%s\"",node->module->name);
  }
  jsons_print_text(out,"description","text",node->dsc,1,(int *)0x0);
  jsons_print_text(out,"reference","text",node->ref,1,(int *)0x0);
  jsons_print_status(out,node->flags,(int *)0x0);
  first_00 = (int *)(ulong)node->iffeature_size;
  jsons_print_iffeatures(out,node->module,node->iffeature,node->iffeature_size,(int *)0x0);
  jsons_print_typedefs(out,(lys_tpdf *)node[1].name,node->padding[2],first_00);
  jsons_print_musts(out,(lys_restr *)node[1].dsc,node->padding[1],(int *)0x0);
  jsons_print_nodes_(out,node->child,"groupings",0x800,(int *)0x0);
  jsons_print_data(out,node->module,node->child,(int *)0x0);
  ly_print(out,"}");
  return;
}

Assistant:

static void
jsons_print_notif(struct lyout *out, const struct lys_node *node, int *first)
{
    struct lys_node_notif *ntf = (struct lys_node_notif *)node;

    jsons_print_object(out, node->name, "nodetype", jsons_nodetype_str(node->nodetype), 0, first);
    ly_print(out, ",\"module\":\"%s\"", lys_main_module(node->module)->name);
    if (node->module->type) {
        ly_print(out, ",\"included-from\":\"%s\"", node->module->name);
    }
    jsons_print_text(out, "description", "text", ntf->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", ntf->ref, 1, NULL);
    jsons_print_status(out, ntf->flags, NULL);
    jsons_print_iffeatures(out, ntf->module, ntf->iffeature, ntf->iffeature_size, NULL);
    jsons_print_typedefs(out, ntf->tpdf, ntf->tpdf_size, NULL);
    jsons_print_musts(out, ntf->must, ntf->must_size, NULL);

    jsons_print_groupings(out, ntf->child, NULL);
    jsons_print_data(out, ntf->module, ntf->child, NULL);
    ly_print(out, "}");
}